

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.cpp
# Opt level: O3

void __thiscall slang::IntervalMapDetails::Path::moveRight(Path *this,uint32_t level)

{
  int iVar1;
  int iVar2;
  pointer pEVar3;
  uint32_t uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  
  pEVar3 = (this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  iVar9 = -1;
  iVar1 = 0;
  do {
    iVar2 = iVar1;
    if (level - 1 == iVar2) {
      uVar7 = pEVar3->size;
      uVar4 = pEVar3->offset;
      uVar8 = 0;
      goto LAB_0032d22f;
    }
    uVar7 = pEVar3[level + iVar9].size;
    uVar4 = pEVar3[level + iVar9].offset;
    iVar9 = iVar9 + -1;
    iVar1 = iVar2 + 1;
  } while (uVar4 == uVar7 - 1);
  uVar8 = level - (iVar2 + 1);
LAB_0032d22f:
  uVar5 = uVar4 + 1;
  pEVar3[uVar8].offset = uVar5;
  if (uVar5 != uVar7) {
    uVar6 = *(ulong *)((long)pEVar3[uVar8].node + (ulong)uVar5 * 8);
    if (iVar2 != 0) {
      iVar2 = -iVar2;
      do {
        uVar7 = level + iVar2;
        pEVar3 = (this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
        pEVar3[uVar7].node = (ulong *)(uVar6 & 0xffffffffffffffc0);
        pEVar3[uVar7].size = ((uint)uVar6 & 0x3f) + 1;
        pEVar3[uVar7].offset = 0;
        uVar6 = *(ulong *)(uVar6 & 0xffffffffffffffc0);
        iVar2 = iVar2 + 1;
      } while (iVar2 != 0);
      pEVar3 = (this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    }
    pEVar3[level].node = (void *)(uVar6 & 0xffffffffffffffc0);
    pEVar3[level].size = ((uint)uVar6 & 0x3f) + 1;
    pEVar3[level].offset = 0;
  }
  return;
}

Assistant:

void Path::moveRight(uint32_t level) {
    SLANG_ASSERT(level);

    // Go up the tree until we find a node where we can go right.
    uint32_t l = level - 1;
    while (l && path[l].offset == path[l].size - 1)
        --l;

    // If we hit the end we've gone as far as we can.
    if (++path[l].offset == path[l].size)
        return;

    NodeRef nodeRef = childAt(l);
    for (++l; l != level; ++l) {
        path[l] = Entry(nodeRef, 0);
        nodeRef = nodeRef.childAt(0);
    }
    path[l] = Entry(nodeRef, 0);
}